

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O2

Literal * wasm::Literal::makeNull(Literal *__return_storage_ptr__,HeapType type)

{
  BasicHeapType BVar1;
  HeapType heapType;
  HeapType local_28;
  HeapType type_local;
  
  local_28.id = type.id;
  BVar1 = HeapType::getBottom(&local_28);
  heapType.id._4_4_ = 0;
  heapType.id._0_4_ = BVar1;
  Type::Type((Type *)&type_local,heapType,Nullable,Inexact);
  wasm::Literal::Literal(__return_storage_ptr__,(Type)type_local.id);
  return __return_storage_ptr__;
}

Assistant:

static Literal makeNull(HeapType type) {
    return Literal(Type(type.getBottom(), Nullable));
  }